

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

void Assimp::IFC::ExtractVerticesFromClipper
               (Polygon *poly,
               vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *temp_contour,
               bool filter_duplicates)

{
  bool bVar1;
  aiVector2t<double> local_90;
  aiVector2t<double> local_80;
  aiVector2t<double> local_70;
  aiVector2t<double> local_60;
  undefined1 local_50 [8];
  IfcVector2 vv;
  IntPoint *point;
  const_iterator __end2;
  const_iterator __begin2;
  Polygon *__range2;
  bool filter_duplicates_local;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *temp_contour_local;
  Polygon *poly_local;
  
  std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::clear(temp_contour);
  __end2 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin(poly);
  point = (IntPoint *)
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end(poly);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                                *)&point);
    if (!bVar1) {
      return;
    }
    vv.y = (double)__gnu_cxx::
                   __normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                   ::operator*(&__end2);
    aiVector2t<double>::aiVector2t
              ((aiVector2t<double> *)local_50,(double)((reference)vv.y)->X / 1518500249.0,
               (double)((reference)vv.y)->Y / 1518500249.0);
    aiVector2t<double>::aiVector2t(&local_70);
    local_60 = std::max<double>((aiVector2t<double> *)local_50,&local_70);
    local_50 = (undefined1  [8])local_60.x;
    vv.x = local_60.y;
    aiVector2t<double>::aiVector2t(&local_90,1.0,1.0);
    local_80 = std::min<double>((aiVector2t<double> *)local_50,&local_90);
    local_50 = (undefined1  [8])local_80.x;
    vv.x = local_80.y;
    if (filter_duplicates) {
      bVar1 = IsDuplicateVertex((IfcVector2 *)local_50,temp_contour);
      if (!bVar1) goto LAB_009a2f94;
    }
    else {
LAB_009a2f94:
      std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                (temp_contour,(value_type *)local_50);
    }
    __gnu_cxx::
    __normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void ExtractVerticesFromClipper(const ClipperLib::Polygon& poly, std::vector<IfcVector2>& temp_contour,
    bool filter_duplicates = false)
{
    temp_contour.clear();
    for(const ClipperLib::IntPoint& point : poly) {
        IfcVector2 vv = IfcVector2( from_int64(point.X), from_int64(point.Y));
        vv = std::max(vv,IfcVector2());
        vv = std::min(vv,one_vec);

        if (!filter_duplicates || !IsDuplicateVertex(vv, temp_contour)) {
            temp_contour.push_back(vv);
        }
    }
}